

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_time.cpp
# Opt level: O3

double __thiscall BmsTimeManager::GetMinBPM(BmsTimeManager *this)

{
  _Base_ptr p_Var1;
  _Rb_tree_node_base *p_Var2;
  _Base_ptr p_Var3;
  
  p_Var2 = (this->array_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = p_Var2[1]._M_right;
  p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
  while ((_Rb_tree_header *)p_Var2 != &(this->array_)._M_t._M_impl.super__Rb_tree_header) {
    p_Var3 = p_Var2[1]._M_right;
    if ((double)p_Var1 <= (double)p_Var2[1]._M_right) {
      p_Var3 = p_Var1;
    }
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    p_Var1 = p_Var3;
  }
  return (double)p_Var1;
}

Assistant:

double BmsTimeManager::GetMinBPM() {
	double bpm = array_.begin()->second.bpm;
	for (auto it = ++array_.begin(); it != array_.end(); ++it) {
		bpm = std::min(bpm, IT(it).bpm);
	}
	return bpm;
}